

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::initializeMapBuilder
          (CommonCore *this,string_view request,uint16_t index,QueryReuse reuse,bool force_ordering)

{
  _Tuple_impl<2UL,_helics::QueryReuse> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  json_value jVar3;
  pointer ppVar4;
  pointer pcVar5;
  BaseTimeCoordinator *pBVar6;
  size_type sVar7;
  FederateStates FVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  pointer ptVar12;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  reference pvVar13;
  FedInfo **ppFVar14;
  int extraout_var;
  string *psVar15;
  value_t vVar16;
  undefined6 in_register_0000000a;
  long lVar17;
  uint uVar18;
  GlobalFederateId *dep;
  FedInfo *pFVar19;
  _Alloc_hider _Var20;
  action_t startingAction;
  FedInfo **ppFVar21;
  string *this_01;
  FedInfo **ppFVar22;
  pointer ppVar23;
  ulong uVar24;
  JsonMapBuilder *this_02;
  CommonCore *pCVar25;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string_view queryStr_02;
  string ret;
  ActionMessage queryReq;
  string local_230;
  CommonCore *local_210;
  size_t local_208;
  JsonMapBuilder *local_200;
  byte *local_1f8;
  uint local_1f0;
  uint local_1ec;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_1e8;
  uint local_1dc;
  FedInfo **local_1d8;
  FedInfo **local_1d0;
  data local_1c8;
  string local_1b8;
  ulong local_190;
  data local_188;
  key_type local_178;
  string local_158;
  data local_138;
  string local_128;
  data local_108;
  data local_f8;
  ActionMessage local_e8;
  
  local_1f8 = (byte *)request._M_str;
  local_208 = request._M_len;
  uVar11 = (uint)CONCAT62(in_register_0000000a,index);
  ptVar12 = (this->mapBuilders).
            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_210 = this;
  if ((((uint)(*(int *)&(this->mapBuilders).
                        super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (int)ptVar12) >> 5) *
       -0x55555555 & 0xffff) <= uVar11) {
    std::
    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
    ::resize(&this->mapBuilders,(CONCAT62(in_register_0000000a,index) & 0xffffffff) + 1);
    ptVar12 = (this->mapBuilders).
              super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar25 = local_210;
  p_Var1 = &(ptVar12->
            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            ).
            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            .super__Tuple_impl<2UL,_helics::QueryReuse> + uVar11 * 0x60;
  this_02 = (JsonMapBuilder *)(p_Var1 + 0x20);
  (p_Var1->super__Head_base<2UL,_helics::QueryReuse,_false>)._M_head_impl = reuse;
  fileops::JsonMapBuilder::reset(this_02);
  local_200 = this_02;
  this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)fileops::JsonMapBuilder::getJValue_abi_cxx11_(this_02);
  BrokerBase::addBaseInformation(&pCVar25->super_BrokerBase,(json *)this_00,true);
  startingAction = cmd_query;
  if (force_ordering) {
    startingAction = cmd_query_ordered;
  }
  ActionMessage::ActionMessage(&local_e8,startingAction);
  if (index == 8) {
    ActionMessage::setAction(&local_e8,cmd_query_ordered);
  }
  if (local_e8.payload.heap == local_1f8) {
    local_e8.payload.bufferSize = local_208;
  }
  else {
    SmallBuffer::reserve(&local_e8.payload,local_208);
    local_e8.payload.bufferSize = local_208;
    if (local_208 != 0) {
      memcpy(local_e8.payload.heap,local_1f8,local_208);
    }
  }
  local_e8.source_id.gid = (pCVar25->super_BrokerBase).global_broker_id_local.gid;
  local_e8.counter = index;
  if ((((pCVar25->loopFederates).dataStorage.csize != 0) ||
      (pCVar25->filterFed != (FilterFederate *)0x0)) ||
     (pCVar25->translatorFed != (TranslatorFederate *)0x0)) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f8,(initializer_list_t)ZEXT816(0),false,array);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"federates");
    vVar16 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_f8.m_type;
    jVar3 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = local_f8.m_value;
    local_f8.m_type = vVar16;
    local_f8.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_f8);
    if ((pCVar25->loopFederates).dataStorage.csize == 0) {
      uVar18 = (pCVar25->loopFederates).dataStorage.bsize;
      ppFVar14 = (pCVar25->loopFederates).dataStorage.dataptr;
      if ((long)(int)uVar18 == 0x20) {
        lVar17 = (long)(pCVar25->loopFederates).dataStorage.dataSlotIndex;
        if (ppFVar14 == (FedInfo **)0x0) {
          ppFVar22 = (FedInfo **)
                     &gmlc::containers::
                      StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                      emptyValue;
        }
        else {
          ppFVar22 = ppFVar14 + lVar17 + 1;
        }
        pFVar19 = *ppFVar22;
        uVar24 = 0;
        uVar18 = 0x20;
      }
      else {
        lVar17 = (long)(pCVar25->loopFederates).dataStorage.dataSlotIndex;
        ppFVar22 = ppFVar14 + lVar17;
        pFVar19 = *ppFVar22 + (int)uVar18;
        uVar24 = (ulong)uVar18;
      }
    }
    else {
      ppFVar14 = (pCVar25->loopFederates).dataStorage.dataptr;
      pFVar19 = *ppFVar14;
      uVar18 = (pCVar25->loopFederates).dataStorage.bsize;
      lVar17 = (long)(pCVar25->loopFederates).dataStorage.dataSlotIndex;
      uVar24 = 0;
      ppFVar22 = ppFVar14;
    }
    if (ppFVar14 == (FedInfo **)0x0) {
      ppFVar21 = (FedInfo **)
                 &gmlc::containers::
                  StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                  emptyValue;
    }
    else {
      ppFVar21 = ppFVar14 + lVar17 + 1;
    }
    local_1d8 = ppFVar14 + lVar17;
    if (uVar18 == 0x20) {
      local_1d8 = ppFVar21;
    }
    local_1dc = 0;
    if (uVar18 != 0x20) {
      local_1dc = uVar18;
    }
    local_1f0 = uVar11;
    local_1e8 = this_00;
    if (((uint)uVar24 != local_1dc) || (ppFVar22 != local_1d8)) {
      local_1ec = (uint)force_ordering;
      do {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        local_1d0 = ppFVar22;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"federates","");
        iVar9 = fileops::JsonMapBuilder::generatePlaceHolder
                          (local_200,&local_230,(pFVar19->fed->global_id)._M_i.gid);
        local_190 = uVar24;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        queryStr_01._M_str = (char *)local_1f8;
        queryStr_01._M_len = local_208;
        federateQuery_abi_cxx11_(&local_230,local_210,pFVar19->fed,queryStr_01,SUB41(local_1ec,0));
        iVar10 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_230,"#wait");
        if (iVar10 == 0) {
          FVar8 = FederateState::getState(pFVar19->fed);
          if (FVar8 < TERMINATING) {
            local_e8.dest_id.gid = (pFVar19->fed->global_id)._M_i.gid;
            local_e8.messageID = iVar9;
            FederateState::addAction(pFVar19->fed,&local_e8);
          }
          else {
            queryStr_02._M_str = "global_state";
            queryStr_02._M_len = 0xc;
            federateQuery_abi_cxx11_
                      (&local_1b8,local_210,pFVar19->fed,queryStr_02,SUB41(local_1ec,0));
            fileops::JsonMapBuilder::addComponent(local_200,&local_1b8,iVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          fileops::JsonMapBuilder::addComponent(local_200,&local_230,iVar9);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        iVar9 = (int)local_190;
        uVar11 = iVar9 + 1;
        if (iVar9 < 0x1f) {
          pFVar19 = pFVar19 + 1;
          ppFVar22 = local_1d0;
        }
        else {
          uVar11 = uVar11 & 0x1f;
          pFVar19 = (FedInfo *)
                    ((long)&local_1d0[(ulong)(iVar9 - 0x1fU >> 5) + 1]->fed + (ulong)(uVar11 << 4));
          ppFVar22 = local_1d0 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
        }
        uVar24 = (ulong)uVar11;
      } while ((uVar11 != local_1dc) || (ppFVar22 != local_1d8));
    }
    this_00 = local_1e8;
    pCVar25 = local_210;
    if (local_210->filterFed != (FilterFederate *)0x0) {
      paVar2 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"federates","");
      iVar9 = fileops::JsonMapBuilder::generatePlaceHolder
                        (local_200,&local_230,(pCVar25->filterFedID)._M_i.gid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      queryStr._M_str = (char *)local_1f8;
      queryStr._M_len = local_208;
      FilterFederate::query_abi_cxx11_(&local_230,pCVar25->filterFed,queryStr);
      fileops::JsonMapBuilder::addComponent(local_200,&local_230,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
    }
    pCVar25 = local_210;
    uVar11 = local_1f0;
    if (local_210->translatorFed != (TranslatorFederate *)0x0) {
      paVar2 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"federates","");
      iVar9 = fileops::JsonMapBuilder::generatePlaceHolder
                        (local_200,&local_230,(pCVar25->translatorFedID)._M_i.gid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      queryStr_00._M_str = (char *)local_1f8;
      queryStr_00._M_len = local_208;
      TranslatorFederate::query_abi_cxx11_(&local_230,pCVar25->translatorFed,queryStr_00);
      fileops::JsonMapBuilder::addComponent(local_200,&local_230,iVar9);
      pCVar25 = local_210;
      uVar11 = local_1f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        pCVar25 = local_210;
        uVar11 = local_1f0;
      }
    }
  }
  switch(uVar11 & 0xffff) {
  case 2:
  case 9:
    if ((pCVar25->super_BrokerBase).hasTimeDependency != true) break;
    iVar9 = (*((pCVar25->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
              _vptr_BaseTimeCoordinator[0xd])();
    lVar17 = (CONCAT44(extraout_var,iVar9) / 1000000000 + ((long)extraout_var >> 0x1f)) -
             ((long)extraout_var >> 0x1f);
    local_158._M_dataplus._M_p = (pointer)0x0;
    local_158._M_string_length = 0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_158,
               (double)(CONCAT44(extraout_var,iVar9) + lVar17 * -1000000000) * 1e-09 +
               (double)lVar17);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"next_time");
    vVar16 = (pvVar13->m_data).m_type;
    this_01 = &local_158;
    goto LAB_002eef8c;
  case 3:
    if ((pCVar25->super_BrokerBase).hasTimeDependency == true) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_108,(initializer_list_t)ZEXT816(0),false,array);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"dependents");
      vVar16 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_108.m_type;
      jVar3 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = local_108.m_value;
      local_108.m_type = vVar16;
      local_108.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_108);
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_230,
                 (pCVar25->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      sVar7 = local_230._M_string_length;
      if (local_230._M_dataplus._M_p != (pointer)local_230._M_string_length) {
        _Var20._M_p = local_230._M_dataplus._M_p;
        do {
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(this_00,"dependents");
          local_1b8._M_dataplus._M_p = (pointer)0x0;
          local_1b8._M_string_length = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1b8,(long)*(int *)_Var20._M_p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_1b8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1b8);
          _Var20._M_p = _Var20._M_p + 4;
          pCVar25 = local_210;
        } while (_Var20._M_p != (pointer)sVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_230._M_dataplus._M_p,
                        local_230.field_2._M_allocated_capacity - (long)local_230._M_dataplus._M_p);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_128.field_2,(initializer_list_t)ZEXT816(0),false,array);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"dependencies");
      vVar16 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_128.field_2._M_local_buf[0];
      jVar3 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = (json_value)local_128.field_2._8_8_;
      local_128.field_2._M_local_buf[0] = vVar16;
      local_128.field_2._8_8_ = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_128.field_2);
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_230,
                 (pCVar25->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      if (local_230._M_dataplus._M_p != (pointer)local_230._M_string_length) {
        _Var20._M_p = local_230._M_dataplus._M_p;
        do {
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(this_00,"dependencies");
          local_1b8._M_dataplus._M_p = (pointer)0x0;
          local_1b8._M_string_length = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1b8,(long)*(int *)_Var20._M_p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_1b8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1b8);
          _Var20._M_p = _Var20._M_p + 4;
        } while (_Var20._M_p != (pointer)local_230._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_230._M_dataplus._M_p,
                        local_230.field_2._M_allocated_capacity - (long)local_230._M_dataplus._M_p);
      }
    }
    break;
  case 6:
    psVar15 = brokerStateName_abi_cxx11_((pCVar25->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_128,psVar15);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"state");
    vVar16 = (pvVar13->m_data).m_type;
    this_01 = &local_128;
LAB_002eef8c:
    (pvVar13->m_data).m_type = *(value_t *)&(this_01->_M_dataplus)._M_p;
    *(value_t *)&(this_01->_M_dataplus)._M_p = vVar16;
    jVar3 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = (json_value)this_01->_M_string_length;
    this_01->_M_string_length = (size_type)jVar3;
LAB_002eefa2:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)this_01);
    break;
  case 7:
    psVar15 = brokerStateName_abi_cxx11_((pCVar25->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_138,psVar15);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"state");
    vVar16 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_138.m_type;
    jVar3 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = local_138.m_value;
    local_138.m_type = vVar16;
    local_138.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_138);
    pBVar6 = (pCVar25->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    if ((pBVar6 != (BaseTimeCoordinator *)0x0) &&
       (*(pointer *)
         &(pBVar6->dependencies).dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
        (pBVar6->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      local_188.m_type = null;
      local_188.m_value.object = (object_t *)0x0;
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"time");
      local_188.m_type = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = null;
      jVar3 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value.object = (object_t *)local_188.m_value;
      local_188.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_188);
      pBVar6 = (pCVar25->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"time");
      (*pBVar6->_vptr_BaseTimeCoordinator[0xc])(pBVar6,pvVar13);
    }
    break;
  case 0xe:
    if ((pCVar25->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar25->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    local_1e8 = this_00;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_230,(initializer_list_t)ZEXT816(0),false,object);
    ppVar23 = (pCVar25->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (pCVar25->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar23 != ppVar4) {
      do {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1c8,&ppVar23->second);
        pcVar5 = (ppVar23->first)._M_dataplus._M_p;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,pcVar5,pcVar5 + (ppVar23->first)._M_string_length);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_230,&local_178);
        vVar16 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_1c8.m_type;
        jVar3 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = local_1c8.m_value;
        local_1c8.m_type = vVar16;
        local_1c8.m_value = jVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1c8);
        ppVar23 = ppVar23 + 1;
      } while (ppVar23 != ppVar4);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_158.field_2,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_230);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(local_1e8,"tags");
    vVar16 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_158.field_2._M_local_buf[0];
    jVar3 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = (json_value)local_158.field_2._8_8_;
    local_158.field_2._M_local_buf[0] = vVar16;
    local_158.field_2._8_8_ = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_158.field_2);
    this_01 = &local_230;
    goto LAB_002eefa2;
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CommonCore::initializeMapBuilder(std::string_view request,
                                      std::uint16_t index,
                                      QueryReuse reuse,
                                      bool force_ordering) const
{
    if (!isValidIndex(index, mapBuilders)) {
        mapBuilders.resize(static_cast<size_t>(index) + 1);
    }
    std::get<2>(mapBuilders[index]) = reuse;
    auto& builder = std::get<0>(mapBuilders[index]);
    builder.reset();
    nlohmann::json& base = builder.getJValue();
    addBaseInformation(base, true);
    ActionMessage queryReq(force_ordering ? CMD_QUERY_ORDERED : CMD_QUERY);
    if (index == GLOBAL_FLUSH) {
        queryReq.setAction(CMD_QUERY_ORDERED);
    }
    queryReq.payload = request;
    queryReq.source_id = global_broker_id_local;
    queryReq.counter = index;  // indicating which processing to use
    if (loopFederates.size() > 0 || filterFed != nullptr || translatorFed != nullptr) {
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : loopFederates) {
            const int brkindex =
                builder.generatePlaceHolder("federates", fed->global_id.load().baseValue());
            const std::string ret = federateQuery(fed.fed, request, force_ordering);
            if (ret == "#wait") {
                if (fed->getState() <= FederateStates::EXECUTING) {
                    queryReq.messageID = brkindex;
                    queryReq.dest_id = fed.fed->global_id;
                    fed.fed->addAction(queryReq);
                } else {
                    // the federate has terminated or errored so is waiting, global_state doesn't
                    // block
                    builder.addComponent(federateQuery(fed.fed, "global_state", force_ordering),
                                         brkindex);
                }
            } else {
                builder.addComponent(ret, brkindex);
            }
        }
        if (filterFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", filterFedID.load().baseValue());
            const std::string ret = filterFed->query(request);
            builder.addComponent(ret, brkindex);
        }
        if (translatorFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", translatorFedID.load().baseValue());
            const std::string ret = translatorFed->query(request);
            builder.addComponent(ret, brkindex);
        }
    }

    switch (index) {
        case CURRENT_TIME_MAP:
        case GLOBAL_STATUS:
            if (hasTimeDependency) {
                base["next_time"] = static_cast<double>(timeCoord->getNextTime());
            }
            break;
        case DEPENDENCY_GRAPH: {
            if (hasTimeDependency) {
                base["dependents"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependents()) {
                    base["dependents"].push_back(dep.baseValue());
                }
                base["dependencies"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependencies()) {
                    base["dependencies"].push_back(dep.baseValue());
                }
            }
        } break;
        case GLOBAL_STATE:
            base["state"] = brokerStateName(getBrokerState());
            break;
        case GLOBAL_TIME_DEBUGGING:
            base["state"] = brokerStateName(getBrokerState());
            if (timeCoord && !timeCoord->empty()) {
                base["time"] = nlohmann::json();
                timeCoord->generateDebuggingTimeInfo(base["time"]);
            }
            break;
        case UNCONNECTED_INTERFACES:
            if (!tags.empty()) {
                nlohmann::json tagBlock = nlohmann::json::object();
                for (const auto& tag : tags) {
                    tagBlock[tag.first] = tag.second;
                }
                base["tags"] = tagBlock;
            }
            break;
        default:
            break;
    }
}